

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O1

void duckdb::ArraySliceFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  undefined8 *puVar1;
  char cVar2;
  LogicalTypeId LVar3;
  idx_t source_count;
  unsigned_long *puVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  anon_union_16_2_67f50693_for_value *paVar6;
  ulong *puVar7;
  long *plVar8;
  list_entry_t *plVar9;
  long *plVar10;
  undefined8 uVar11;
  string_t input;
  string_t input_00;
  string_t input_01;
  string_t input_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var12;
  long lVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  bool bVar18;
  long __tmp;
  reference pvVar19;
  reference this;
  reference pvVar20;
  BoundFunctionExpression *pBVar21;
  pointer pFVar22;
  Vector *pVVar23;
  buffer_ptr<ValidityBuffer> *pbVar24;
  data_ptr_t pdVar25;
  ulong uVar26;
  TemplatedValidityData<unsigned_long> *pTVar27;
  idx_t iVar28;
  NotImplementedException *this_00;
  ulong uVar29;
  element_type *peVar30;
  ulong uVar31;
  uint64_t *puVar32;
  idx_t iVar33;
  long lVar34;
  byte bVar35;
  idx_t idx_in_entry;
  ulong uVar36;
  sel_t sVar37;
  long lVar38;
  int64_t length;
  ulong uVar39;
  long lVar40;
  Allocator *pAVar41;
  byte bVar42;
  long offset;
  uint64_t uVar43;
  bool bVar44;
  bool bVar45;
  bool bVar46;
  list_entry_t lVar47;
  anon_union_16_2_67f50693_for_value aVar48;
  list_entry_t lVar49;
  string_t input_03;
  string_t input_04;
  string_t input_05;
  string_t input_06;
  list_entry_t input_07;
  undefined7 in_stack_fffffffffffffde8;
  char cVar50;
  idx_t local_200;
  optional_ptr<duckdb::Vector,_true> local_1f0;
  long begin_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d8;
  list_entry_t sliced;
  optional_ptr<duckdb::Vector,_true> local_1b8;
  long end;
  idx_t local_1a8;
  long begin_1;
  SelectionVector sel;
  data_ptr_t local_178;
  unsigned_long *local_170;
  UnifiedVectorFormat begin_data;
  list_entry_t str;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  long begin;
  data_ptr_t local_c0;
  unsigned_long *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  UnifiedVectorFormat end_data;
  
  source_count = args->count;
  pvVar19 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  VectorOperations::Copy(pvVar19,result,source_count,0,0);
  if ((result->type).id_ == SQLNULL) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    ConstantVector::SetNull(result,true);
    return;
  }
  pvVar19 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this = vector<duckdb::Vector,_true>::operator[](&args->data,2);
  if ((long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(args->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
            super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
            super__Vector_impl_data._M_start == 0x1a0) {
    pvVar20 = vector<duckdb::Vector,_true>::operator[](&args->data,3);
  }
  else {
    pvVar20 = (reference)0x0;
  }
  pBVar21 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar22 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar21->bind_info);
  cVar50 = *(char *)&pFVar22[4]._vptr_FunctionData;
  cVar2 = *(char *)((long)&pFVar22[4]._vptr_FunctionData + 1);
  bVar18 = DataChunk::AllConstant(args);
  Vector::SetVectorType(result,bVar18 * '\x02');
  LVar3 = (result->type).id_;
  if (LVar3 == VARCHAR) {
    if (pvVar20 == (reference)0x0) {
      pVVar23 = (Vector *)0x0;
    }
    else {
      pVVar23 = ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = (data_ptr_t)0x0;
    if (result->vector_type == CONSTANT_VECTOR) {
      puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (*puVar4 & 1) == 0;
      }
      puVar4 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (*puVar4 & 1) == 0;
      }
      puVar4 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar46 = false;
      }
      else {
        bVar46 = (*puVar4 & 1) == 0;
      }
      begin = (long)pVVar23;
      end_data.sel = (SelectionVector *)pvVar20;
      if (pvVar20 == (reference)0x0) {
        bVar35 = 0;
      }
      else {
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&end_data);
        p_Var5 = end_data.sel[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar35 = 1;
        }
        else {
          bVar35 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar18 || bVar45) || bVar46) || (end_data.sel != (SelectionVector *)0x0 && bVar35 == 0))
      {
        ConstantVector::SetNull(result,true);
      }
      else {
        paVar6 = (anon_union_16_2_67f50693_for_value *)result->data;
        plVar10 = (long *)pvVar19->data;
        plVar8 = (long *)this->data;
        if (end_data.sel == (SelectionVector *)0x0) {
          peVar30 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          peVar30 = end_data.sel[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        uVar16 = str.offset._4_4_;
        uVar14 = (undefined4)str.offset;
        begin_data.sel = *(SelectionVector **)paVar6;
        begin_data.data = (data_ptr_t)(paVar6->pointer).ptr;
        if (cVar50 == '\0') {
          begin_4 = *plVar10;
        }
        else {
          begin_4 = 0;
        }
        str.offset._0_4_ = SUB84(begin_data.sel,0);
        uVar15 = (undefined4)str.offset;
        str.offset._4_4_ = (undefined4)((ulong)begin_data.sel >> 0x20);
        uVar17 = str.offset._4_4_;
        if (cVar2 == '\0') {
          lVar40 = *plVar8;
          lVar38 = lVar40;
          str.offset._0_4_ = uVar14;
          str.offset._4_4_ = uVar16;
        }
        else {
          if (((ulong)begin_data.sel & 0xffffffff) == 0) {
            lVar38 = 0;
          }
          else {
            uVar36 = 0;
            lVar38 = 0;
            do {
              lVar38 = lVar38 + 1;
              uVar36 = uVar36 + 1;
            } while (((ulong)begin_data.sel & 0xffffffff) != uVar36);
          }
          lVar40 = 0;
          str.length = (uint64_t)begin_data.data;
        }
        sliced.offset._0_4_ = (undefined4)lVar38;
        sliced.offset._4_4_ = (undefined4)((ulong)lVar38 >> 0x20);
        if (peVar30 == (element_type *)0x0) {
          pAVar41 = (Allocator *)0x1;
        }
        else {
          pAVar41 = (peVar30->owned_data).allocator.ptr;
        }
        if ((long)pAVar41 < 0) {
          if (cVar50 != '\0') {
            str.offset._0_4_ = uVar15;
            str.offset._4_4_ = uVar17;
            if (((ulong)begin_data.sel & 0xffffffff) == 0) {
              begin_4 = 0;
              str.length = (uint64_t)begin_data.data;
            }
            else {
              uVar36 = 0;
              begin_4 = 0;
              do {
                begin_4 = begin_4 + 1;
                uVar36 = uVar36 + 1;
                str.length = (uint64_t)begin_data.data;
              } while (((ulong)begin_data.sel & 0xffffffff) != uVar36);
            }
          }
          sliced.offset._0_4_ = (undefined4)begin_4;
          sliced.offset._4_4_ = (undefined4)((ulong)begin_4 >> 0x20);
          begin_4 = lVar40;
        }
        bVar42 = pAVar41 == (Allocator *)0x1 | bVar35;
        if (bVar42 == 1) {
          ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                    ((string_t *)&begin_data,&begin_4,(long *)&sliced);
        }
        if ((bVar35 == 1 && pAVar41 != (Allocator *)0x1) &&
           (begin_4 < (long)CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))) {
          iVar28 = CalculateSliceLength<long>
                             (begin_4,CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),
                              (long)pAVar41,true);
          bVar18 = true;
          SelectionVector::Initialize(&sel,iVar28);
        }
        else {
          bVar18 = false;
          iVar28 = 0;
        }
        if (bVar42 == 0) {
          ConstantVector::SetNull(result,true);
        }
        else {
          input_01.value.pointer.ptr = (char *)begin_data.data;
          input_01.value._0_8_ = begin_data.sel;
          if (pAVar41 == (Allocator *)0x1) {
            lVar40 = CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset) - begin_4;
            input_06.value.pointer.ptr = (char *)(begin_4 + 1);
            input_06.value._0_8_ = begin_data.data;
            aVar48.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 SubstringUnicode((duckdb *)result,(Vector *)begin_data.sel,input_06,lVar40,lVar40);
          }
          else {
            aVar48.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 StringSliceOperations::SliceValueWithSteps
                           (result,&sel,input_01,begin_4,
                            CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),(int64_t)pAVar41
                            ,(idx_t *)&local_178);
          }
          paVar6->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar48;
        }
        if (bVar18) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin);
          Vector::Slice((Vector *)begin,&sel,iVar28);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin);
          Vector::Flatten((Vector *)begin,iVar28);
          ListVector::SetListSize(result,iVar28);
        }
      }
    }
    else {
      local_1f0.ptr = pvVar20;
      local_1b8.ptr = pVVar23;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
      Vector::ToUnifiedFormat(pvVar19,source_count,&begin_data);
      Vector::ToUnifiedFormat(this,source_count,&end_data);
      if (local_1f0.ptr != (reference)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        Vector::ToUnifiedFormat(local_1f0.ptr,source_count,(UnifiedVectorFormat *)&begin);
        iVar28 = ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar28);
      }
      pdVar25 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (source_count == 0) {
        local_1a8 = 0;
      }
      else {
        pbVar24 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        local_1a8 = 0;
        uVar36 = 0;
        do {
          uVar26 = uVar36;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            uVar26 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                     uVar36 * 4);
          }
          uVar39 = uVar36;
          if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar39 = (ulong)(begin_data.sel)->sel_vector[uVar36];
          }
          uVar31 = uVar36;
          if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(end_data.sel)->sel_vector[uVar36];
          }
          if (local_1f0.ptr == (reference)0x0) {
            uVar29 = 0;
          }
          else {
            uVar29 = uVar36;
            if (*(long *)begin != 0) {
              uVar29 = (ulong)*(uint *)(*(long *)begin + uVar36 * 4);
            }
          }
          if ((unsigned_long *)local_108._M_allocated_capacity == (unsigned_long *)0x0) {
            bVar18 = false;
          }
          else {
            bVar18 = (*(ulong *)(local_108._M_allocated_capacity + (uVar26 >> 6) * 8) >>
                      (uVar26 & 0x3f) & 1) == 0;
          }
          if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar39 >> 6] >> (uVar39 & 0x3f) & 1) == 0;
          }
          if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar31 >> 6] >> (uVar31 & 0x3f) & 1) == 0;
          }
          if (local_1f0.ptr == (reference)0x0) {
            bVar44 = false;
          }
          else if (local_b8 == (unsigned_long *)0x0) {
            bVar44 = true;
          }
          else {
            bVar44 = (local_b8[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0;
          }
          if (((bVar18 || bVar45) || bVar46) || (local_1f0.ptr != (reference)0x0 && !bVar44)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              iVar28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              sliced.offset._0_4_ = (undefined4)iVar28;
              sliced.offset._4_4_ = (undefined4)(iVar28 >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var12 = p_Stack_1e0;
              lVar40 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)lVar40;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (pbVar24);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar35 = (byte)uVar36 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar36 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
          }
          else {
            puVar7 = (ulong *)(str.length + uVar26 * 0x10);
            uVar26 = *puVar7;
            sliced.length = puVar7[1];
            sliced.offset._0_4_ = (undefined4)uVar26;
            sliced.offset._4_4_ = (undefined4)(uVar26 >> 0x20);
            if (cVar50 == '\0') {
              begin_1 = *(long *)(begin_data.data + uVar39 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (cVar2 == '\0') {
              lVar40 = *(long *)(end_data.data + uVar31 * 8);
              end = lVar40;
            }
            else {
              if ((uVar26 & 0xffffffff) == 0) {
                end = 0;
              }
              else {
                uVar39 = 0;
                end = 0;
                do {
                  end = end + 1;
                  uVar39 = uVar39 + 1;
                } while ((uVar26 & 0xffffffff) != uVar39);
              }
              lVar40 = 0;
              begin_4 = uVar26;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
            }
            if (local_1f0.ptr == (reference)0x0) {
              lVar38 = 1;
            }
            else {
              lVar38 = *(long *)(local_c0 + uVar29 * 8);
            }
            if ((lVar38 < 0) && (end = begin_1, begin_1 = lVar40, cVar50 != '\0')) {
              if ((uVar26 & 0xffffffff) == 0) {
                end = 0;
                begin_4 = uVar26;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
              }
              else {
                uVar39 = 0;
                end = 0;
                do {
                  end = end + 1;
                  uVar39 = uVar39 + 1;
                  begin_4 = uVar26;
                  p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sliced.length;
                } while ((uVar26 & 0xffffffff) != uVar39);
              }
            }
            bVar18 = (bool)(lVar38 == 1 | bVar44);
            lVar40 = lVar38;
            if (bVar18) {
              ClampSlice<duckdb::string_t,long,duckdb::StringSliceOperations>
                        ((string_t *)&sliced,&begin_1,&end);
            }
            lVar34 = begin_1;
            lVar13 = end;
            offset = end - begin_1;
            if (offset == 0 || end < begin_1) {
              local_200 = 0;
            }
            else {
              local_200 = CalculateSliceLength<long>(begin_1,end,lVar38,bVar44);
            }
            if (bVar18) {
              input_00.value._4_1_ = sliced.offset._4_1_;
              input_00.value._5_1_ = sliced.offset._5_1_;
              input_00.value._6_1_ = sliced.offset._6_1_;
              input_00.value._7_1_ = sliced.offset._7_1_;
              input_00.value.pointer.length = (undefined4)sliced.offset;
              input_00.value.pointer.ptr = (char *)sliced.length;
              if (local_1f0.ptr == (reference)0x0) {
                input_04.value.pointer.ptr = (char *)(lVar34 + 1);
                input_04.value._0_8_ = sliced.length;
                aVar48.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     SubstringUnicode((duckdb *)result,
                                      (Vector *)
                                      CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),
                                      input_04,offset,lVar40);
              }
              else {
                aVar48.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     StringSliceOperations::SliceValueWithSteps
                               (result,&sel,input_00,lVar34,lVar13,lVar38,(idx_t *)&local_178);
              }
              *(long *)(pdVar25 + uVar36 * 0x10) = aVar48._0_8_;
              *(char **)(pdVar25 + uVar36 * 0x10 + 8) = aVar48.pointer.ptr;
            }
            else {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_170 = (unsigned_long *)
                            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,(unsigned_long *)&local_170);
                p_Var12 = p_Stack_1e0;
                lVar40 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)lVar40;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var12;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (pbVar24);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar35 = (byte)uVar36 & 0x3f;
              puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar36 >> 6);
              *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
            }
            local_1a8 = local_1a8 + local_200;
          }
          uVar36 = uVar36 + 1;
        } while (uVar36 != source_count);
      }
      iVar28 = local_1a8;
      if (local_1f0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar28 != 0) {
          iVar33 = 0;
          do {
            sVar37 = (sel_t)iVar33;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar37 = sel.sel_vector[iVar33];
            }
            *(sel_t *)(begin_4 + iVar33 * 4) = sVar37;
            iVar33 = iVar33 + 1;
          } while (iVar28 != iVar33);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Slice(local_1b8.ptr,(SelectionVector *)&begin_4,iVar28);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Flatten(local_1b8.ptr,iVar28);
        ListVector::SetListSize(result,iVar28);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
      }
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      }
      if (end_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (begin_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
      }
      if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
      }
    }
    Vector::Verify(result,source_count);
  }
  else if (LVar3 == BLOB) {
    if (pvVar20 == (reference)0x0) {
      pVVar23 = (Vector *)0x0;
    }
    else {
      pVVar23 = ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = (data_ptr_t)0x0;
    if (result->vector_type == CONSTANT_VECTOR) {
      puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (*puVar4 & 1) == 0;
      }
      puVar4 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (*puVar4 & 1) == 0;
      }
      puVar4 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar46 = false;
      }
      else {
        bVar46 = (*puVar4 & 1) == 0;
      }
      end_data.sel = (SelectionVector *)pVVar23;
      if (pvVar20 == (reference)0x0) {
        bVar35 = 0;
        begin_data.sel = (SelectionVector *)pvVar20;
      }
      else {
        begin_data.sel = (SelectionVector *)pvVar20;
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        p_Var5 = begin_data.sel[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar35 = 1;
        }
        else {
          bVar35 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar18 || bVar45) || bVar46) ||
         (begin_data.sel != (SelectionVector *)0x0 && bVar35 == 0)) {
        ConstantVector::SetNull(result,true);
      }
      else {
        paVar6 = (anon_union_16_2_67f50693_for_value *)result->data;
        plVar10 = (long *)pvVar19->data;
        puVar7 = (ulong *)this->data;
        if (begin_data.sel == (SelectionVector *)0x0) {
          peVar30 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          peVar30 = begin_data.sel[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        uVar36 = *(ulong *)paVar6;
        str.length = (uint64_t)(paVar6->pointer).ptr;
        str.offset._0_4_ = (undefined4)uVar36;
        str.offset._4_4_ = (undefined4)(uVar36 >> 0x20);
        if (cVar50 == '\0') {
          begin = *plVar10;
        }
        else {
          begin = 0;
        }
        if (cVar2 == '\0') {
          uVar26 = *puVar7;
          begin_4 = uVar26;
        }
        else {
          uVar26 = 0;
          begin_4 = uVar36 & 0xffffffff;
        }
        if (peVar30 == (element_type *)0x0) {
          pAVar41 = (Allocator *)0x1;
        }
        else {
          pAVar41 = (peVar30->owned_data).allocator.ptr;
        }
        if (((long)pAVar41 < 0) && (begin_4 = begin, begin = uVar26, cVar50 != '\0')) {
          begin_4 = uVar36 & 0xffffffff;
        }
        bVar42 = pAVar41 == (Allocator *)0x1 | bVar35;
        if (bVar42 == 1) {
          ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                    ((string_t *)&str,&begin,&begin_4);
        }
        if ((bVar35 == 1 && pAVar41 != (Allocator *)0x1) && (begin < begin_4)) {
          iVar28 = CalculateSliceLength<long>(begin,begin_4,(long)pAVar41,true);
          bVar18 = true;
          SelectionVector::Initialize(&sel,iVar28);
        }
        else {
          bVar18 = false;
          iVar28 = 0;
        }
        if (bVar42 == 0) {
          ConstantVector::SetNull(result,true);
        }
        else {
          input_02.value._4_1_ = str.offset._4_1_;
          input_02.value._5_1_ = str.offset._5_1_;
          input_02.value._6_1_ = str.offset._6_1_;
          input_02.value._7_1_ = str.offset._7_1_;
          input_02.value.pointer.length = (undefined4)str.offset;
          input_02.value.pointer.ptr = (char *)str.length;
          if (pAVar41 == (Allocator *)0x1) {
            input_05.value.pointer.ptr = (char *)(begin + 1);
            input_05.value._0_8_ = str.length;
            aVar48.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 SubstringASCII((duckdb *)result,
                                (Vector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset),input_05
                                ,begin_4 - begin,begin_4 - begin);
          }
          else {
            aVar48.pointer =
                 (anon_struct_16_3_d7536bce_for_pointer)
                 BlobSliceOperations::SliceValueWithSteps
                           (result,&sel,input_02,begin,begin_4,(int64_t)pAVar41,(idx_t *)&local_178)
            ;
          }
          paVar6->pointer = (anon_struct_16_3_d7536bce_for_pointer)aVar48;
        }
        if (bVar18) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Slice((Vector *)end_data.sel,&sel,iVar28);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Flatten((Vector *)end_data.sel,iVar28);
          ListVector::SetListSize(result,iVar28);
        }
      }
    }
    else {
      local_1f0.ptr = pvVar20;
      local_1b8.ptr = pVVar23;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
      Vector::ToUnifiedFormat(pvVar19,source_count,&begin_data);
      Vector::ToUnifiedFormat(this,source_count,&end_data);
      if (local_1f0.ptr != (reference)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        Vector::ToUnifiedFormat(local_1f0.ptr,source_count,(UnifiedVectorFormat *)&begin);
        iVar28 = ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar28);
      }
      pdVar25 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (source_count == 0) {
        local_1a8 = 0;
      }
      else {
        pbVar24 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        pdVar25 = pdVar25 + 8;
        local_1a8 = 0;
        uVar36 = 0;
        do {
          uVar26 = uVar36;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            uVar26 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                     uVar36 * 4);
          }
          uVar39 = uVar36;
          if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar39 = (ulong)(begin_data.sel)->sel_vector[uVar36];
          }
          uVar31 = uVar36;
          if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(end_data.sel)->sel_vector[uVar36];
          }
          if (local_1f0.ptr == (reference)0x0) {
            uVar29 = 0;
          }
          else {
            uVar29 = uVar36;
            if (*(long *)begin != 0) {
              uVar29 = (ulong)*(uint *)(*(long *)begin + uVar36 * 4);
            }
          }
          if ((unsigned_long *)local_108._M_allocated_capacity == (unsigned_long *)0x0) {
            bVar18 = false;
          }
          else {
            bVar18 = (*(ulong *)(local_108._M_allocated_capacity + (uVar26 >> 6) * 8) >>
                      (uVar26 & 0x3f) & 1) == 0;
          }
          if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            length = 0;
          }
          else {
            length = CONCAT71((int7)(begin_data.validity.super_TemplatedValidityMask<unsigned_long>.
                                     validity_mask[uVar39 >> 6] >> 8),
                              (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.
                               validity_mask[uVar39 >> 6] >> (uVar39 & 0x3f) & 1) == 0);
          }
          if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar31 >> 6] >> (uVar31 & 0x3f) & 1) == 0;
          }
          if (local_1f0.ptr == (reference)0x0) {
            bVar46 = false;
          }
          else if (local_b8 == (unsigned_long *)0x0) {
            bVar46 = true;
          }
          else {
            bVar46 = (local_b8[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0;
          }
          if (((bVar18 || (char)length != '\0') || bVar45) ||
             (local_1f0.ptr != (reference)0x0 && bVar46 == false)) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              iVar28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              sliced.offset._0_4_ = (undefined4)iVar28;
              sliced.offset._4_4_ = (undefined4)(iVar28 >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var12 = p_Stack_1e0;
              lVar40 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)lVar40;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (pbVar24);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar35 = (byte)uVar36 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar36 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
          }
          else {
            puVar7 = (ulong *)(str.length + uVar26 * 0x10);
            uVar26 = *puVar7;
            sliced.length = puVar7[1];
            sliced.offset._0_4_ = (undefined4)uVar26;
            sliced.offset._4_4_ = (undefined4)(uVar26 >> 0x20);
            if (cVar50 == '\0') {
              begin_1 = *(long *)(begin_data.data + uVar39 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (cVar2 == '\0') {
              uVar39 = *(ulong *)(end_data.data + uVar31 * 8);
              end = uVar39;
            }
            else {
              uVar39 = 0;
              end = uVar26 & 0xffffffff;
            }
            if (local_1f0.ptr == (reference)0x0) {
              lVar40 = 1;
            }
            else {
              lVar40 = *(long *)(local_c0 + uVar29 * 8);
            }
            if ((lVar40 < 0) && (end = begin_1, begin_1 = uVar39, cVar50 != '\0')) {
              end = uVar26 & 0xffffffff;
            }
            bVar35 = lVar40 == 1 | bVar46;
            if (bVar35 == 1) {
              ClampSlice<duckdb::string_t,long,duckdb::BlobSliceOperations>
                        ((string_t *)&sliced,&begin_1,&end);
            }
            lVar13 = begin_1;
            lVar38 = end;
            lVar34 = end - begin_1;
            if (lVar34 == 0 || end < begin_1) {
              iVar28 = 0;
            }
            else {
              iVar28 = CalculateSliceLength<long>(begin_1,end,lVar40,bVar46);
            }
            if (bVar35 == 0) {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_170 = (unsigned_long *)
                            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,(unsigned_long *)&local_170);
                p_Var12 = p_Stack_1e0;
                lVar40 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)lVar40;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var12;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (pbVar24);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar35 = (byte)uVar36 & 0x3f;
              puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar36 >> 6);
              *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
            }
            else {
              input.value._4_1_ = sliced.offset._4_1_;
              input.value._5_1_ = sliced.offset._5_1_;
              input.value._6_1_ = sliced.offset._6_1_;
              input.value._7_1_ = sliced.offset._7_1_;
              input.value.pointer.length = (undefined4)sliced.offset;
              input.value.pointer.ptr = (char *)sliced.length;
              if (local_1f0.ptr == (reference)0x0) {
                input_03.value.pointer.ptr = (char *)(lVar13 + 1);
                input_03.value._0_8_ = sliced.length;
                aVar48.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     SubstringASCII((duckdb *)result,
                                    (Vector *)
                                    CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),input_03
                                    ,lVar34,length);
              }
              else {
                aVar48.pointer =
                     (anon_struct_16_3_d7536bce_for_pointer)
                     BlobSliceOperations::SliceValueWithSteps
                               (result,&sel,input,lVar13,lVar38,lVar40,(idx_t *)&local_178);
              }
              *(long *)(pdVar25 + -8) = aVar48._0_8_;
              *(char **)pdVar25 = aVar48.pointer.ptr;
            }
            local_1a8 = local_1a8 + iVar28;
          }
          uVar36 = uVar36 + 1;
          pdVar25 = pdVar25 + 0x10;
        } while (source_count != uVar36);
      }
      iVar28 = local_1a8;
      if (local_1f0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar28 != 0) {
          iVar33 = 0;
          do {
            sVar37 = (sel_t)iVar33;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar37 = sel.sel_vector[iVar33];
            }
            *(sel_t *)(begin_4 + iVar33 * 4) = sVar37;
            iVar33 = iVar33 + 1;
          } while (iVar28 != iVar33);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Slice(local_1b8.ptr,(SelectionVector *)&begin_4,iVar28);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Flatten(local_1b8.ptr,iVar28);
        ListVector::SetListSize(result,iVar28);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
      }
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      }
      if (end_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (begin_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
      }
      if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
      }
    }
    Vector::Verify(result,source_count);
  }
  else {
    if (LVar3 != LIST) {
      this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      str.offset = (uint64_t)&local_108;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&str,"Specifier type not implemented","");
      NotImplementedException::NotImplementedException(this_00,(string *)&str);
      __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if ((result->vector_type & ~CONSTANT_VECTOR) != FLAT_VECTOR) {
      Vector::Flatten(result,source_count);
    }
    if (pvVar20 == (reference)0x0) {
      pVVar23 = (Vector *)0x0;
    }
    else {
      pVVar23 = ListVector::GetEntry(result);
    }
    sel.sel_vector = (sel_t *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    sel.selection_data.internal.
    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178 = (data_ptr_t)0x0;
    if (result->vector_type == CONSTANT_VECTOR) {
      puVar4 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (*puVar4 & 1) == 0;
      }
      puVar4 = (pvVar19->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar45 = false;
      }
      else {
        bVar45 = (*puVar4 & 1) == 0;
      }
      puVar4 = (this->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar4 == (unsigned_long *)0x0) {
        bVar46 = false;
      }
      else {
        bVar46 = (*puVar4 & 1) == 0;
      }
      end_data.sel = (SelectionVector *)pVVar23;
      if (pvVar20 == (reference)0x0) {
        bVar35 = 0;
        begin_data.sel = (SelectionVector *)pvVar20;
      }
      else {
        begin_data.sel = (SelectionVector *)pvVar20;
        optional_ptr<duckdb::Vector,_true>::CheckValid
                  ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
        p_Var5 = begin_data.sel[1].selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          bVar35 = 1;
        }
        else {
          bVar35 = *(byte *)&p_Var5->_vptr__Sp_counted_base & 1;
        }
      }
      if (((bVar18 || bVar45) || bVar46) ||
         (begin_data.sel != (SelectionVector *)0x0 && bVar35 == 0)) {
        ConstantVector::SetNull(result,true);
      }
      else {
        plVar9 = (list_entry_t *)result->data;
        plVar10 = (long *)pvVar19->data;
        puVar32 = (uint64_t *)this->data;
        if (begin_data.sel == (SelectionVector *)0x0) {
          peVar30 = (element_type *)0x0;
        }
        else {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&begin_data);
          peVar30 = begin_data.sel[1].selection_data.internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        str.length = plVar9->length;
        str.offset._0_4_ = (undefined4)plVar9->offset;
        str.offset._4_4_ = (undefined4)(plVar9->offset >> 0x20);
        if (cVar50 == '\0') {
          begin = *plVar10;
        }
        else {
          begin = 0;
        }
        if (cVar2 == '\0') {
          uVar43 = *puVar32;
          begin_4 = uVar43;
        }
        else {
          uVar43 = 0;
          begin_4 = str.length;
        }
        if (peVar30 == (element_type *)0x0) {
          pAVar41 = (Allocator *)0x1;
        }
        else {
          pAVar41 = (peVar30->owned_data).allocator.ptr;
        }
        if (((long)pAVar41 < 0) && (begin_4 = begin, begin = uVar43, cVar50 != '\0')) {
          begin_4 = str.length;
        }
        bVar42 = pAVar41 == (Allocator *)0x1 | bVar35;
        if (bVar42 == 1) {
          ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>(&str,&begin,&begin_4);
        }
        if ((bVar35 == 1 && pAVar41 != (Allocator *)0x1) && (begin < begin_4)) {
          iVar28 = CalculateSliceLength<long>(begin,begin_4,(long)pAVar41,true);
          bVar18 = true;
          SelectionVector::Initialize(&sel,iVar28);
        }
        else {
          bVar18 = false;
          iVar28 = 0;
        }
        if (bVar42 == 0) {
          ConstantVector::SetNull(result,true);
        }
        else {
          if (pAVar41 == (Allocator *)0x1) {
            lVar49.length = begin_4 - begin;
            lVar49.offset =
                 (long)&((SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset))->
                        sel_vector + begin;
          }
          else {
            input_07.length = begin;
            input_07.offset = str.length;
            lVar49 = ListSliceOperations::SliceValueWithSteps
                               ((ListSliceOperations *)result,(Vector *)&sel,
                                (SelectionVector *)CONCAT44(str.offset._4_4_,(undefined4)str.offset)
                                ,input_07,begin_4,(int64_t)pAVar41,(int64_t)&local_178,
                                (idx_t *)CONCAT17(cVar50,in_stack_fffffffffffffde8));
          }
          *plVar9 = lVar49;
        }
        if (bVar18) {
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Slice((Vector *)end_data.sel,&sel,iVar28);
          optional_ptr<duckdb::Vector,_true>::CheckValid
                    ((optional_ptr<duckdb::Vector,_true> *)&end_data);
          Vector::Flatten((Vector *)end_data.sel,iVar28);
          ListVector::SetListSize(result,iVar28);
        }
      }
    }
    else {
      local_1f0.ptr = pvVar20;
      local_1b8.ptr = pVVar23;
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&str);
      UnifiedVectorFormat::UnifiedVectorFormat(&begin_data);
      UnifiedVectorFormat::UnifiedVectorFormat(&end_data);
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&begin);
      Vector::ToUnifiedFormat(result,source_count,(UnifiedVectorFormat *)&str);
      Vector::ToUnifiedFormat(pvVar19,source_count,&begin_data);
      Vector::ToUnifiedFormat(this,source_count,&end_data);
      if (local_1f0.ptr != (reference)0x0) {
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1f0);
        Vector::ToUnifiedFormat(local_1f0.ptr,source_count,(UnifiedVectorFormat *)&begin);
        iVar28 = ListVector::GetListSize(result);
        SelectionVector::Initialize(&sel,iVar28);
      }
      pdVar25 = result->data;
      FlatVector::VerifyFlatVector(result);
      if (source_count == 0) {
        local_1a8 = 0;
      }
      else {
        pbVar24 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
        puVar32 = (uint64_t *)(pdVar25 + 8);
        local_1a8 = 0;
        uVar36 = 0;
        do {
          uVar26 = uVar36;
          if (*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) != 0) {
            uVar26 = (ulong)*(uint *)(*(long *)CONCAT44(str.offset._4_4_,(undefined4)str.offset) +
                                     uVar36 * 4);
          }
          uVar39 = uVar36;
          if ((begin_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar39 = (ulong)(begin_data.sel)->sel_vector[uVar36];
          }
          uVar31 = uVar36;
          if ((end_data.sel)->sel_vector != (sel_t *)0x0) {
            uVar31 = (ulong)(end_data.sel)->sel_vector[uVar36];
          }
          if (local_1f0.ptr == (reference)0x0) {
            uVar29 = 0;
          }
          else {
            uVar29 = uVar36;
            if (*(long *)begin != 0) {
              uVar29 = (ulong)*(uint *)(*(long *)begin + uVar36 * 4);
            }
          }
          if ((unsigned_long *)local_108._M_allocated_capacity == (unsigned_long *)0x0) {
            bVar18 = false;
          }
          else {
            bVar18 = (*(ulong *)(local_108._M_allocated_capacity + (uVar26 >> 6) * 8) >>
                      (uVar26 & 0x3f) & 1) == 0;
          }
          if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar45 = false;
          }
          else {
            bVar45 = (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar39 >> 6] >> (uVar39 & 0x3f) & 1) == 0;
          }
          if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
              (unsigned_long *)0x0) {
            bVar46 = false;
          }
          else {
            bVar46 = (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
                      [uVar31 >> 6] >> (uVar31 & 0x3f) & 1) == 0;
          }
          if (local_1f0.ptr == (reference)0x0) {
            bVar44 = false;
          }
          else if (local_b8 == (unsigned_long *)0x0) {
            bVar44 = true;
          }
          else {
            bVar44 = (local_b8[uVar29 >> 6] >> (uVar29 & 0x3f) & 1) != 0;
          }
          if (((bVar18 || bVar45) || bVar46) || (local_1f0.ptr != (reference)0x0 && bVar44 == false)
             ) {
            if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (unsigned_long *)0x0) {
              iVar28 = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
              sliced.offset._0_4_ = (undefined4)iVar28;
              sliced.offset._4_4_ = (undefined4)(iVar28 >> 0x20);
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&begin_4,&sliced.offset);
              p_Var12 = p_Stack_1e0;
              lVar40 = begin_4;
              begin_4 = 0;
              p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                       internal.
                       super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_refcount._M_pi;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)lVar40;
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var12;
              if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
              }
              if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
              }
              pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (pbVar24);
              (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (unsigned_long *)
                   (pTVar27->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>;
            }
            bVar35 = (byte)uVar36 & 0x3f;
            puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                     (uVar36 >> 6);
            *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
          }
          else {
            puVar1 = (undefined8 *)(str.length + uVar26 * 0x10);
            uVar11 = *puVar1;
            sliced.length = puVar1[1];
            sliced.offset._0_4_ = (undefined4)uVar11;
            sliced.offset._4_4_ = (undefined4)((ulong)uVar11 >> 0x20);
            if (cVar50 == '\0') {
              begin_1 = *(long *)(begin_data.data + uVar39 * 8);
            }
            else {
              begin_1 = 0;
            }
            if (cVar2 == '\0') {
              uVar43 = *(uint64_t *)(end_data.data + uVar31 * 8);
              end = uVar43;
            }
            else {
              uVar43 = 0;
              end = sliced.length;
            }
            if (local_1f0.ptr == (reference)0x0) {
              lVar40 = 1;
            }
            else {
              lVar40 = *(long *)(local_c0 + uVar29 * 8);
            }
            if ((lVar40 < 0) && (end = begin_1, begin_1 = uVar43, cVar50 != '\0')) {
              end = sliced.length;
            }
            bVar35 = lVar40 == 1 | bVar44;
            if (bVar35 == 1) {
              ClampSlice<duckdb::list_entry_t,long,duckdb::ListSliceOperations>
                        (&sliced,&begin_1,&end);
            }
            lVar13 = begin_1;
            lVar38 = end;
            uVar43 = end - begin_1;
            if (uVar43 == 0 || end < begin_1) {
              iVar28 = 0;
            }
            else {
              iVar28 = CalculateSliceLength<long>(begin_1,end,lVar40,bVar44);
            }
            if (bVar35 == 0) {
              if ((result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                  (unsigned_long *)0x0) {
                local_170 = (unsigned_long *)
                            (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)&begin_4,(unsigned_long *)&local_170);
                p_Var12 = p_Stack_1e0;
                lVar40 = begin_4;
                begin_4 = 0;
                p_Stack_1e0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                p_Var5 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data
                         .internal.
                         super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr = (element_type *)lVar40;
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                .
                super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi = p_Var12;
                if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
                }
                if (p_Stack_1e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1e0);
                }
                pTVar27 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    (pbVar24);
                (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                     (unsigned_long *)
                     (pTVar27->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar35 = (byte)uVar36 & 0x3f;
              puVar7 = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask +
                       (uVar36 >> 6);
              *puVar7 = *puVar7 & (-2L << bVar35 | 0xfffffffffffffffeU >> 0x40 - bVar35);
            }
            else if (local_1f0.ptr == (reference)0x0) {
              puVar32[-1] = (long)&((SelectionVector *)
                                   CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset))->
                                   sel_vector + lVar13;
              *puVar32 = uVar43;
            }
            else {
              lVar47.length = lVar13;
              lVar47.offset = sliced.length;
              lVar47 = ListSliceOperations::SliceValueWithSteps
                                 ((ListSliceOperations *)result,(Vector *)&sel,
                                  (SelectionVector *)
                                  CONCAT44(sliced.offset._4_4_,(undefined4)sliced.offset),lVar47,
                                  lVar38,lVar40,(int64_t)&local_178,
                                  (idx_t *)CONCAT17(cVar50,in_stack_fffffffffffffde8));
              puVar32[-1] = lVar47.offset;
              *puVar32 = lVar47.length;
            }
            local_1a8 = local_1a8 + iVar28;
          }
          uVar36 = uVar36 + 1;
          puVar32 = puVar32 + 2;
        } while (source_count != uVar36);
      }
      iVar28 = local_1a8;
      if (local_1f0.ptr != (reference)0x0) {
        SelectionVector::SelectionVector((SelectionVector *)&begin_4,local_1a8);
        if (iVar28 != 0) {
          iVar33 = 0;
          do {
            sVar37 = (sel_t)iVar33;
            if (sel.sel_vector != (sel_t *)0x0) {
              sVar37 = sel.sel_vector[iVar33];
            }
            *(sel_t *)(begin_4 + iVar33 * 4) = sVar37;
            iVar33 = iVar33 + 1;
          } while (iVar28 != iVar33);
        }
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Slice(local_1b8.ptr,(SelectionVector *)&begin_4,iVar28);
        optional_ptr<duckdb::Vector,_true>::CheckValid(&local_1b8);
        Vector::Flatten(local_1b8.ptr,iVar28);
        ListVector::SetListSize(result,iVar28);
        if (local_1d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d8._M_pi);
        }
      }
      if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
      }
      if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      }
      if (end_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (end_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (begin_data.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (begin_data.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
      }
      if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
      }
    }
    Vector::Verify(result,source_count);
  }
  if (sel.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (sel.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  return;
}

Assistant:

static void ArraySliceFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	D_ASSERT(args.ColumnCount() == 3 || args.ColumnCount() == 4);
	D_ASSERT(args.data.size() == 3 || args.data.size() == 4);
	auto count = args.size();

	Vector &list_or_str_vector = result;
	// this ensures that we do not change the input chunk
	VectorOperations::Copy(args.data[0], list_or_str_vector, count, 0, 0);

	if (list_or_str_vector.GetType().id() == LogicalTypeId::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::SetNull(result, true);
		return;
	}

	Vector &begin_vector = args.data[1];
	Vector &end_vector = args.data[2];

	optional_ptr<Vector> step_vector;
	if (args.ColumnCount() == 4) {
		step_vector = &args.data[3];
	}

	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<ListSliceBindData>();
	auto begin_is_empty = info.begin_is_empty;
	auto end_is_empty = info.end_is_empty;

	result.SetVectorType(args.AllConstant() ? VectorType::CONSTANT_VECTOR : VectorType::FLAT_VECTOR);
	switch (result.GetType().id()) {
	case LogicalTypeId::LIST: {
		// Share the value dictionary as we are just going to slice it
		if (list_or_str_vector.GetVectorType() != VectorType::FLAT_VECTOR &&
		    list_or_str_vector.GetVectorType() != VectorType::CONSTANT_VECTOR) {
			list_or_str_vector.Flatten(count);
		}
		ExecuteSlice<list_entry_t, int64_t, ListSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                         step_vector, count, begin_is_empty, end_is_empty);
		break;
	}
	case LogicalTypeId::BLOB:
		ExecuteSlice<string_t, int64_t, BlobSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                     step_vector, count, begin_is_empty, end_is_empty);
		break;
	case LogicalTypeId::VARCHAR:
		ExecuteSlice<string_t, int64_t, StringSliceOperations>(result, list_or_str_vector, begin_vector, end_vector,
		                                                       step_vector, count, begin_is_empty, end_is_empty);
		break;
	default:
		throw NotImplementedException("Specifier type not implemented");
	}
}